

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

int __thiscall ON_String::Replace(ON_String *this,char *token1,char *token2)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  ON_Internal_Empty_aString *pOVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int i;
  size_t local_78;
  size_t local_70;
  int local_68;
  int len;
  ulong local_60;
  size_t local_58;
  char *local_50;
  ON_SimpleArray<int> n;
  
  if ((token1 != (char *)0x0) && (*token1 != '\0')) {
    pcVar12 = "";
    if (token2 != (char *)0x0) {
      pcVar12 = token2;
    }
    sVar4 = strlen(token1);
    uVar13 = (uint)sVar4;
    if (0 < (int)uVar13) {
      local_58 = strlen(pcVar12);
      pOVar5 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
      if (this->m_s == (char *)0x0) {
        pOVar5 = &empty_astring;
      }
      iVar11 = (pOVar5->header).string_length;
      local_78 = CONCAT44(local_78._4_4_,iVar11 - uVar13);
      if ((int)uVar13 <= iVar11) {
        len = iVar11;
        local_50 = pcVar12;
        ON_SimpleArray<int>::ON_SimpleArray(&n,0x20);
        pcVar12 = this->m_s;
        i = 0;
        local_70 = sVar4;
        while (sVar4 = local_58, iVar10 = i, i <= (int)local_78) {
          iVar2 = strncmp(pcVar12,token1,(ulong)(uVar13 & 0x7fffffff));
          if (iVar2 == 0) {
            ON_SimpleArray<int>::Append(&n,&i);
            i = i + (int)local_70;
            pcVar12 = pcVar12 + (uVar13 & 0x7fffffff);
          }
          else {
            pcVar12 = pcVar12 + 1;
            i = iVar10 + 1;
          }
        }
        uVar15 = (ulong)(uint)n.m_count;
        uVar13 = (uint)local_58;
        iVar2 = (int)local_70;
        iVar10 = (uVar13 - iVar2) * n.m_count + iVar11;
        if (iVar10 == 0) {
          Destroy(this);
          iVar11 = n.m_count;
        }
        else {
          CopyArray(this);
          iVar3 = iVar11;
          if (iVar11 < iVar10) {
            iVar3 = iVar10;
          }
          ReserveArray(this,(long)iVar3);
          local_68 = iVar10;
          local_60 = uVar15;
          if (iVar2 < (int)uVar13) {
            uVar6 = 0;
            uVar8 = 0;
            if (0 < n.m_count) {
              uVar8 = (ulong)(uint)n.m_count;
            }
            for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
              n.m_a[uVar6] = n.m_a[uVar6] + iVar2;
            }
            local_78 = sVar4 & 0xffffffff;
            while (0 < (int)uVar15) {
              uVar15 = uVar15 - 1;
              iVar3 = n.m_a[uVar15];
              lVar9 = (long)iVar10;
              iVar10 = iVar10 - uVar13;
              lVar7 = (long)iVar11;
              iVar11 = iVar11 - iVar2;
              for (; iVar3 < lVar7; lVar7 = lVar7 + -1) {
                this->m_s[lVar9 + -1] = this->m_s[lVar7 + -1];
                lVar9 = lVar9 + -1;
                iVar10 = iVar10 + -1;
                iVar11 = iVar11 + -1;
              }
              memcpy(this->m_s + iVar10,local_50,local_78);
            }
          }
          else {
            uVar1 = *n.m_a;
            uVar15 = (ulong)uVar1;
            ON_SimpleArray<int>::Append(&n,&len);
            sVar4 = local_58;
            local_78 = (size_t)(uVar13 & 0x7fffffff);
            uVar8 = 0;
            uVar6 = 0;
            if (0 < (int)local_60) {
              uVar6 = local_60 & 0xffffffff;
            }
            uVar14 = (ulong)uVar1;
            while (iVar11 = (int)uVar14, uVar8 != uVar6) {
              if (0 < (int)sVar4) {
                memcpy(this->m_s + iVar11,local_50,local_78);
                iVar11 = iVar11 + (int)sVar4;
              }
              iVar10 = n.m_a[uVar8 + 1];
              uVar8 = uVar8 + 1;
              uVar14 = (ulong)iVar11;
              for (uVar15 = (ulong)((int)uVar15 + (int)local_70); (long)uVar15 < (long)iVar10;
                  uVar15 = uVar15 + 1) {
                this->m_s[uVar14] = this->m_s[uVar15];
                uVar14 = uVar14 + 1;
              }
            }
          }
          pcVar12 = this->m_s;
          pOVar5 = (ON_Internal_Empty_aString *)(pcVar12 + -0xc);
          if (pcVar12 == (char *)0x0) {
            pOVar5 = &empty_astring;
          }
          (pOVar5->header).string_length = local_68;
          pcVar12[local_68] = '\0';
          iVar11 = (int)local_60;
        }
        ON_SimpleArray<int>::~ON_SimpleArray(&n);
        return iVar11;
      }
    }
  }
  return 0;
}

Assistant:

int ON_String::Replace( const char* token1, const char* token2 )
{
  int count = 0;

  if ( 0 != token1 && 0 != token1[0] )
  {
    if ( 0 == token2 )
      token2 = "";
    const int len1 = (int)strlen(token1);
    if ( len1 > 0 )
    {
      const int len2 = (int)strlen(token2);
      int len = Length();
      if ( len >= len1 )
      {
        // in-place
        ON_SimpleArray<int> n(32);
        const char* s = m_s;
        int i;
        for ( i = 0; i <= len-len1; /*empty*/ )
        {
          if ( strncmp(s,token1,len1) )
          {
            s++;
            i++;
          }
          else
          {
            n.Append(i);
            i += len1;
            s += len1;
          }
        }

        count = n.Count();

        // reserve array space - must be done even when len2 <= len1
        // so that shared arrays are not corrupted.
        const int newlen = len + (count*(len2-len1));
        if ( 0 == newlen )
        {
          Destroy();
          return count;
        }

        CopyArray();

        // 24 August 2006 Dale Lear
        //    This used to say
        //       ReserveArray(newlen);
        //    but when newlen < len and the string had multiple
        //    references, the ReserveArray(newlen) call truncated
        //    the input array.  
        ReserveArray( ((newlen<len) ? len : newlen) );

        int i0, i1, ni, j;

        if ( len2 > len1 )
        {
          // copy from back to front
          i1 = newlen;
          i0 = len;
          for ( ni =0; ni < count; ni++ )
            n[ni] = n[ni] + len1;
          for ( ni = count-1; ni >= 0; ni-- )
          {
            j = n[ni];
            while ( i0 > j )
            {
              i0--;
              i1--;
              m_s[i1] = m_s[i0];
            }
            i1 -= len2;
            i0 -= len1;
            memcpy(&m_s[i1],token2,len2*sizeof(m_s[0]));
          }
        }
        else
        {
          // copy from front to back
          i0 = i1 = n[0];
          n.Append(len);
          for ( ni = 0; ni < count; ni++ )
          {
            if ( len2 > 0 )
            {
              memcpy(&m_s[i1],token2,len2*sizeof(m_s[0]));
              i1 += len2;
            }
            i0 += len1;
            j = n[ni+1];
            while ( i0 < j )
            {
              m_s[i1++] = m_s[i0++];
            }
          }
        }
        Header()->string_length = newlen;
        m_s[newlen] = 0;
      }
    }
  }

  return count;
}